

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O1

int DSA_do_check_signature(int *out_valid,uint8_t *digest,size_t digest_len,DSA_SIG *sig,DSA *dsa)

{
  BN_MONT_CTX **pmont;
  bool bVar1;
  int iVar2;
  uint uVar3;
  BN_CTX *ctx;
  BN_MONT_CTX *pBVar4;
  BIGNUM *pBVar5;
  int iVar6;
  BIGNUM u2;
  BIGNUM u1;
  BIGNUM t1;
  
  *out_valid = 0;
  iVar2 = dsa_check_key(dsa);
  if (iVar2 == 0) {
    return 0;
  }
  if (dsa->pub_key == (BIGNUM *)0x0) {
    ERR_put_error(10,0,0x65,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                  ,0x28f);
    return 0;
  }
  BN_init((BIGNUM *)&u1);
  BN_init((BIGNUM *)&u2);
  BN_init((BIGNUM *)&t1);
  ctx = BN_CTX_new();
  if (ctx != (BN_CTX *)0x0) {
    iVar2 = BN_is_zero(sig->r);
    iVar6 = 1;
    bVar1 = true;
    if (iVar2 != 0) goto LAB_005330cd;
    iVar2 = BN_is_negative(sig->r);
    if ((((iVar2 != 0) || (iVar2 = BN_ucmp((BIGNUM *)sig->r,(BIGNUM *)dsa->q), -1 < iVar2)) ||
        (iVar2 = BN_is_zero(sig->s), iVar2 != 0)) ||
       ((iVar2 = BN_is_negative(sig->s), iVar2 != 0 ||
        (iVar2 = BN_ucmp((BIGNUM *)sig->s,(BIGNUM *)dsa->q), -1 < iVar2)))) {
LAB_00532f1f:
      iVar6 = 1;
      bVar1 = true;
      goto LAB_005330cd;
    }
    iVar2 = (int)dsa + 0x28;
    pBVar4 = BN_MONT_CTX_set_locked((BN_MONT_CTX **)&dsa->method_mont_p,iVar2,(BIGNUM *)dsa->p,ctx);
    if ((int)pBVar4 != 0) {
      pmont = &dsa->method_mont_q;
      pBVar4 = BN_MONT_CTX_set_locked((BN_MONT_CTX **)pmont,iVar2,(BIGNUM *)dsa->q,ctx);
      if ((((int)pBVar4 != 0) &&
          (iVar2 = BN_from_montgomery((BIGNUM *)&u2,(BIGNUM *)sig->s,(BN_MONT_CTX *)*pmont,ctx),
          iVar2 != 0)) &&
         (pBVar5 = BN_mod_inverse((BIGNUM *)&u2,(BIGNUM *)&u2,(BIGNUM *)dsa->q,ctx),
         pBVar5 != (BIGNUM *)0x0)) {
        uVar3 = BN_num_bits((BIGNUM *)dsa->q);
        if (uVar3 >> 3 < digest_len) {
          digest_len = (ulong)(uVar3 >> 3);
        }
        pBVar5 = BN_bin2bn(digest,(int)digest_len,(BIGNUM *)&u1);
        if ((((pBVar5 != (BIGNUM *)0x0) &&
             (iVar2 = BN_mod_mul_montgomery
                                ((BIGNUM *)&u1,(BIGNUM *)&u1,(BIGNUM *)&u2,(BN_MONT_CTX *)*pmont,ctx
                                ), iVar2 != 0)) &&
            (iVar2 = BN_mod_mul_montgomery
                               ((BIGNUM *)&u2,(BIGNUM *)sig->r,(BIGNUM *)&u2,(BN_MONT_CTX *)*pmont,
                                ctx), iVar2 != 0)) &&
           (iVar2 = BN_mod_exp2_mont((BIGNUM *)&t1,(BIGNUM *)dsa->g,(BIGNUM *)&u1,
                                     (BIGNUM *)dsa->pub_key,(BIGNUM *)&u2,(BIGNUM *)dsa->p,ctx,
                                     (BN_MONT_CTX *)dsa->method_mont_p), iVar2 != 0)) {
          iVar6 = 0;
          iVar2 = BN_div((BIGNUM *)0x0,(BIGNUM *)&u1,(BIGNUM *)&t1,(BIGNUM *)dsa->q,ctx);
          if (iVar2 == 0) {
            bVar1 = false;
            goto LAB_005330cd;
          }
          iVar2 = BN_ucmp((BIGNUM *)&u1,(BIGNUM *)sig->r);
          *out_valid = (uint)(iVar2 == 0);
          goto LAB_00532f1f;
        }
      }
    }
  }
  bVar1 = false;
  iVar6 = 0;
LAB_005330cd:
  if (!bVar1) {
    ERR_put_error(10,0,3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                  ,0x2e5);
  }
  BN_CTX_free(ctx);
  BN_free((BIGNUM *)&u1);
  BN_free((BIGNUM *)&u2);
  BN_free((BIGNUM *)&t1);
  return iVar6;
}

Assistant:

int DSA_do_check_signature(int *out_valid, const uint8_t *digest,
                           size_t digest_len, const DSA_SIG *sig,
                           const DSA *dsa) {
  *out_valid = 0;
  if (!dsa_check_key(dsa)) {
    return 0;
  }

  if (dsa->pub_key == NULL) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_MISSING_PARAMETERS);
    return 0;
  }

  int ret = 0;
  BIGNUM u1, u2, t1;
  BN_init(&u1);
  BN_init(&u2);
  BN_init(&t1);
  BN_CTX *ctx = BN_CTX_new();
  {
    if (ctx == NULL) {
      goto err;
    }

    if (BN_is_zero(sig->r) || BN_is_negative(sig->r) ||
        BN_ucmp(sig->r, dsa->q) >= 0) {
      ret = 1;
      goto err;
    }
    if (BN_is_zero(sig->s) || BN_is_negative(sig->s) ||
        BN_ucmp(sig->s, dsa->q) >= 0) {
      ret = 1;
      goto err;
    }

    if (!BN_MONT_CTX_set_locked((BN_MONT_CTX **)&dsa->method_mont_p,
                                (CRYPTO_MUTEX *)&dsa->method_mont_lock, dsa->p,
                                ctx) ||
        !BN_MONT_CTX_set_locked((BN_MONT_CTX **)&dsa->method_mont_q,
                                (CRYPTO_MUTEX *)&dsa->method_mont_lock, dsa->q,
                                ctx)) {
      goto err;
    }

    // Calculate W = inv(S) mod Q, in the Montgomery domain. This is slightly
    // more efficiently computed as FromMont(s)^-1 = (s * R^-1)^-1 = s^-1 * R,
    // instead of ToMont(s^-1) = s^-1 * R.
    if (!BN_from_montgomery(&u2, sig->s, dsa->method_mont_q, ctx) ||
        !BN_mod_inverse(&u2, &u2, dsa->q, ctx)) {
      goto err;
    }

    // save M in u1
    unsigned q_bits = BN_num_bits(dsa->q);
    if (digest_len > (q_bits >> 3)) {
      // if the digest length is greater than the size of q use the
      // BN_num_bits(dsa->q) leftmost bits of the digest, see
      // fips 186-3, 4.2
      digest_len = (q_bits >> 3);
    }

    if (BN_bin2bn(digest, digest_len, &u1) == NULL) {
      goto err;
    }

    // u1 = M * w mod q. w was stored in the Montgomery domain while M was not,
    // so the result will already be out of the Montgomery domain.
    if (!BN_mod_mul_montgomery(&u1, &u1, &u2, dsa->method_mont_q, ctx)) {
      goto err;
    }

    // u2 = r * w mod q. w was stored in the Montgomery domain while r was not,
    // so the result will already be out of the Montgomery domain.
    if (!BN_mod_mul_montgomery(&u2, sig->r, &u2, dsa->method_mont_q, ctx)) {
      goto err;
    }

    if (!BN_mod_exp2_mont(&t1, dsa->g, &u1, dsa->pub_key, &u2, dsa->p, ctx,
                          dsa->method_mont_p)) {
      goto err;
    }

    // let u1 = u1 mod q
    if (!BN_mod(&u1, &t1, dsa->q, ctx)) {
      goto err;
    }

    // V is now in u1.  If the signature is correct, it will be
    // equal to R.
    *out_valid = BN_ucmp(&u1, sig->r) == 0;
    ret = 1;
  }

err:
  if (ret != 1) {
    OPENSSL_PUT_ERROR(DSA, ERR_R_BN_LIB);
  }
  BN_CTX_free(ctx);
  BN_free(&u1);
  BN_free(&u2);
  BN_free(&t1);

  return ret;
}